

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Renderer.cpp
# Opt level: O0

void __thiscall Renderer::Render(Renderer *this)

{
  float n_elements;
  ulong uVar1;
  anon_class_56_7_9d101d1f local_b0;
  function<void_(int,_int)> local_78;
  Camera *local_48;
  Camera *cam;
  Image image;
  float length;
  int iters;
  int h;
  int w;
  Renderer *this_local;
  
  iters = (this->_args).width;
  length = (float)(this->_args).height;
  image._data.super__Vector_base<Vector3f,_std::allocator<Vector3f>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = (this->_args).iters;
  image._data.super__Vector_base<Vector3f,_std::allocator<Vector3f>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = (this->_args).length;
  _h = this;
  Image::Image((Image *)&cam,iters,(int)length);
  local_48 = SceneParser::getCamera(&this->_scene);
  n_elements = length;
  local_b0.h = (int *)&length;
  local_b0.w = &iters;
  local_b0.cam = &local_48;
  local_b0.length =
       (float *)&image._data.super__Vector_base<Vector3f,_std::allocator<Vector3f>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
  local_b0.iters =
       (int *)((long)&image._data.super__Vector_base<Vector3f,_std::allocator<Vector3f>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage + 4);
  local_b0.image = (Image *)&cam;
  local_b0.this = this;
  std::function<void(int,int)>::function<Renderer::Render()::__0,void>
            ((function<void(int,int)> *)&local_78,&local_b0);
  parallel_for((uint)n_elements,&local_78,true);
  std::function<void_(int,_int)>::~function(&local_78);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    Image::savePNG((Image *)&cam,&(this->_args).output_file);
  }
  Image::~Image((Image *)&cam);
  return;
}

Assistant:

void Renderer::Render() {
    // Loop through all the pixels in the image
    // generate all the samples. Fetch necessary args.
    int w = _args.width;
    int h = _args.height;
    int iters = _args.iters;
    float length = _args.length;

    // This look generates camera rays and calls traceRay.
    // It also write to the color image.
    Image image(w, h);
    Camera *cam = _scene.getCamera();

    parallel_for(h, [&](int start, int end) {
        for (int i = start; i < end; ++i) {
            float ndcy = 2 * (i / (h - 1.0f)) - 1.0f;
            parallel_for(w, [&](int innerStart, int innerEnd) {
                for (int j = innerStart; j < innerEnd; ++j) {
                    // Use PerspectiveCamera to generate a ray.
                    float ndcx = 2 * (j / (w - 1.0f)) - 1.0f;
                    Ray r = cam->generateRay(Vector2f(ndcx, ndcy));
                    Vector3f color = estimatePixel(r, 0.01, length, iters);
                    image.setPixel(j, i, color);
                }
            }, true);
        }
    }, true);

    // Save the output file.
    if (!_args.output_file.empty()) {
        image.savePNG(_args.output_file);
    }
}